

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template.h
# Opt level: O0

bool __thiscall
test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::test_binary_add
          (test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *this)

{
  anon_class_32_4_006e9c57 parallel_function;
  size_t end;
  atomic_flag *in_stack_ffffffffffffffc0;
  atomic_flag local_12;
  byte local_11;
  atomic_flag test_lock;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *ptStack_10;
  bool result_is_ok;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *this_local;
  
  local_11 = 1;
  ptStack_10 = this;
  std::atomic_flag::atomic_flag(&local_12,false);
  end = test_uintwide_t_n_base::size((test_uintwide_t_n_base *)this);
  parallel_function.u_boost =
       (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
        **)&local_11;
  parallel_function.u_local = (uintwide_t<24U,_unsigned_char,_void,_false> **)&local_12;
  parallel_function.distribution = (distribution_type *)this;
  parallel_function.rnd_lock = in_stack_ffffffffffffffc0;
  my_concurrency::
  parallel_for<unsigned_long,test_uintwide_t_n_binary_ops_template<8192u,unsigned_int,void>::test_binary_add()const::_lambda(unsigned_long)_1_>
            (0,end,parallel_function);
  return (bool)(local_11 & 1);
}

Assistant:

WIDE_INTEGER_NODISCARD auto test_binary_add() const -> bool
    {
      bool result_is_ok = true;

      std::atomic_flag test_lock = ATOMIC_FLAG_INIT;

      my_concurrency::parallel_for
      (
        static_cast<std::size_t>(0U),
        size(),
        [&test_lock, &result_is_ok, this](std::size_t i)
        {
          const boost_uint_type c_boost = a_boost[i] + b_boost[i];
          const local_uint_type c_local = a_local[i] + b_local[i];

          const std::string str_boost = hexlexical_cast(c_boost);
          const std::string str_local = hexlexical_cast(c_local);

          while(test_lock.test_and_set()) { ; }
          result_is_ok = ((str_boost == str_local) && result_is_ok);
          test_lock.clear();
        }
      );

      return result_is_ok;
    }